

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O2

spv_operand_pattern_t *
spvAlternatePatternFollowingImmediate
          (spv_operand_pattern_t *__return_storage_ptr__,spv_operand_pattern_t *pattern)

{
  spv_operand_pattern_t *alternatePattern;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
  it;
  value_type local_38;
  allocator_type local_31;
  pointer local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
  local_28;
  __normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>
  local_20;
  
  local_28.current._M_current =
       (__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>
        )(pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
  local_30 = (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_38 = SPV_OPERAND_TYPE_RESULT_ID;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<spv_operand_type_t_const*,std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>>>,spv_operand_type_t>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
              *)&local_20,&local_28,(spv_operand_type_t *)&local_30);
  if (local_20._M_current ==
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_start) {
    local_38 = SPV_OPERAND_TYPE_OPTIONAL_CIV;
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
    _M_range_initialize<spv_operand_type_t_const*>
              ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
               __return_storage_ptr__,&local_38);
  }
  else {
    local_38 = SPV_OPERAND_TYPE_OPTIONAL_CIV;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
              (__return_storage_ptr__,
               ((long)(pattern->
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)local_20._M_current >> 2) +
               2,&local_38,&local_31);
    (__return_storage_ptr__->
    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_start[1] = SPV_OPERAND_TYPE_RESULT_ID;
  }
  return __return_storage_ptr__;
}

Assistant:

spv_operand_pattern_t spvAlternatePatternFollowingImmediate(
    const spv_operand_pattern_t& pattern) {
  auto it =
      std::find(pattern.crbegin(), pattern.crend(), SPV_OPERAND_TYPE_RESULT_ID);
  if (it != pattern.crend()) {
    spv_operand_pattern_t alternatePattern(it - pattern.crbegin() + 2,
                                           SPV_OPERAND_TYPE_OPTIONAL_CIV);
    alternatePattern[1] = SPV_OPERAND_TYPE_RESULT_ID;
    return alternatePattern;
  }

  // No result-id found, so just expect CIVs.
  return {SPV_OPERAND_TYPE_OPTIONAL_CIV};
}